

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O0

FileDescriptor * __thiscall
ASDCP::MXF::FileDescriptor::InitFromTLVSet(FileDescriptor *this,TLVReader *TLVSet)

{
  bool bVar1;
  int iVar2;
  MDDEntry *pMVar3;
  MDDEntry *pMVar4;
  MDDEntry *in_RDX;
  TLVReader local_240;
  TLVReader local_1d8;
  TLVReader local_170;
  TLVReader local_108;
  TLVReader local_a0;
  undefined1 local_21;
  MDDEntry *local_20;
  TLVReader *TLVSet_local;
  FileDescriptor *this_local;
  Result_t *result;
  
  TLVSet_local = TLVSet;
  this_local = this;
  if (TLVSet[1].super_MemIOReader.m_p == (byte_t *)0x0) {
    __assert_fail("m_Dict",
                  "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/Metadata.cpp"
                  ,0x568,
                  "virtual ASDCP::Result_t ASDCP::MXF::FileDescriptor::InitFromTLVSet(TLVReader &)")
    ;
  }
  local_21 = 0;
  local_20 = in_RDX;
  GenericDescriptor::InitFromTLVSet(&this->super_GenericDescriptor,TLVSet);
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  pMVar4 = local_20;
  if (-1 < iVar2) {
    pMVar3 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                              MDD_FileDescriptor_LinkedTrackID);
    optional_property<unsigned_int>::get
              ((optional_property<unsigned_int> *)&TLVSet[3].super_MemIOReader.m_capacity);
    TLVReader::ReadUi32(&local_a0,pMVar4,(ui32_t *)pMVar3);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_a0);
    Kumu::Result_t::~Result_t((Result_t *)&local_a0);
    bVar1 = Kumu::Result_t::operator==((Result_t *)this,(Result_t *)Kumu::RESULT_OK);
    optional_property<unsigned_int>::set_has_value
              ((optional_property<unsigned_int> *)&TLVSet[3].super_MemIOReader.m_capacity,bVar1);
  }
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  pMVar4 = local_20;
  if (-1 < iVar2) {
    pMVar3 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                              MDD_FileDescriptor_SampleRate);
    TLVReader::ReadObject(&local_108,pMVar4,(IArchive *)pMVar3);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_108);
    Kumu::Result_t::~Result_t((Result_t *)&local_108);
  }
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  pMVar4 = local_20;
  if (-1 < iVar2) {
    pMVar3 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                              MDD_FileDescriptor_ContainerDuration);
    optional_property<unsigned_long_long>::get
              ((optional_property<unsigned_long_long> *)
               &TLVSet[3].m_ElementMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
    TLVReader::ReadUi64(&local_170,pMVar4,(ui64_t *)pMVar3);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_170);
    Kumu::Result_t::~Result_t((Result_t *)&local_170);
    bVar1 = Kumu::Result_t::operator==((Result_t *)this,(Result_t *)Kumu::RESULT_OK);
    optional_property<unsigned_long_long>::set_has_value
              ((optional_property<unsigned_long_long> *)
               &TLVSet[3].m_ElementMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,bVar1)
    ;
  }
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  pMVar4 = local_20;
  if (-1 < iVar2) {
    pMVar3 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                              MDD_FileDescriptor_EssenceContainer);
    TLVReader::ReadObject(&local_1d8,pMVar4,(IArchive *)pMVar3);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_1d8);
    Kumu::Result_t::~Result_t((Result_t *)&local_1d8);
  }
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  if (-1 < iVar2) {
    pMVar4 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,MDD_FileDescriptor_Codec
                             );
    optional_property<ASDCP::UL>::get
              ((optional_property<ASDCP::UL> *)&TLVSet[4].super_MemIOReader.m_capacity);
    TLVReader::ReadObject(&local_240,local_20,(IArchive *)pMVar4);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_240);
    Kumu::Result_t::~Result_t((Result_t *)&local_240);
    bVar1 = Kumu::Result_t::operator==((Result_t *)this,(Result_t *)Kumu::RESULT_OK);
    optional_property<ASDCP::UL>::set_has_value
              ((optional_property<ASDCP::UL> *)&TLVSet[4].super_MemIOReader.m_capacity,bVar1);
  }
  return this;
}

Assistant:

ASDCP::Result_t
FileDescriptor::InitFromTLVSet(TLVReader& TLVSet)
{
  assert(m_Dict);
  Result_t result = GenericDescriptor::InitFromTLVSet(TLVSet);
  if ( ASDCP_SUCCESS(result) ) { 
    result = TLVSet.ReadUi32(OBJ_READ_ARGS_OPT(FileDescriptor, LinkedTrackID));
    LinkedTrackID.set_has_value( result == RESULT_OK );
  }
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.ReadObject(OBJ_READ_ARGS(FileDescriptor, SampleRate));
  if ( ASDCP_SUCCESS(result) ) { 
    result = TLVSet.ReadUi64(OBJ_READ_ARGS_OPT(FileDescriptor, ContainerDuration));
    ContainerDuration.set_has_value( result == RESULT_OK );
  }
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.ReadObject(OBJ_READ_ARGS(FileDescriptor, EssenceContainer));
  if ( ASDCP_SUCCESS(result) ) {
    result = TLVSet.ReadObject(OBJ_READ_ARGS_OPT(FileDescriptor, Codec));
    Codec.set_has_value( result == RESULT_OK );
  }
  return result;
}